

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteExprList(BinaryWriter *this,Func *func,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  bool bVar3;
  Index IVar4;
  uint32_t uVar5;
  Address AVar6;
  RelocType reloc_type;
  ulong uVar7;
  size_t size;
  ExprList *exprs_00;
  char *pcVar8;
  Opcode OVar9;
  Stream *pSVar10;
  TableCopyExpr *copy_expr;
  Var *var;
  Expr *pEVar11;
  _func_int **local_48;
  Expr *pEStack_40;
  
  pEVar1 = exprs->first_;
  do {
    if (pEVar1 == (Expr *)0x0) {
      return;
    }
    switch(pEVar1->type_) {
    case AtomicLoad:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar6 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < AVar6) {
        uVar5 = 0;
        uVar7 = (ulong)AVar6;
        do {
          uVar7 = uVar7 >> 1;
          uVar5 = uVar5 + 1;
          bVar3 = 3 < AVar6;
          AVar6 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_001534b2;
    case AtomicRmw:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar6 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < AVar6) {
        uVar5 = 0;
        uVar7 = (ulong)AVar6;
        do {
          uVar7 = uVar7 >> 1;
          uVar5 = uVar5 + 1;
          bVar3 = 3 < AVar6;
          AVar6 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_001534b2;
    case AtomicRmwCmpxchg:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar6 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < AVar6) {
        uVar5 = 0;
        uVar7 = (ulong)AVar6;
        do {
          uVar7 = uVar7 >> 1;
          uVar5 = uVar5 + 1;
          bVar3 = 3 < AVar6;
          AVar6 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_001534b2;
    case AtomicStore:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar6 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < AVar6) {
        uVar5 = 0;
        uVar7 = (ulong)AVar6;
        do {
          uVar7 = uVar7 >> 1;
          uVar5 = uVar5 + 1;
          bVar3 = 3 < AVar6;
          AVar6 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_001534b2;
    case AtomicNotify:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar6 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < AVar6) {
        uVar5 = 0;
        uVar7 = (ulong)AVar6;
        do {
          uVar7 = uVar7 >> 1;
          uVar5 = uVar5 + 1;
          bVar3 = 3 < AVar6;
          AVar6 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_001534b2;
    case AtomicWait:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar6 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < AVar6) {
        uVar5 = 0;
        uVar7 = (ulong)AVar6;
        do {
          uVar7 = uVar7 >> 1;
          uVar5 = uVar5 + 1;
          bVar3 = 3 < AVar6;
          AVar6 = (uint)uVar7;
        } while (bVar3);
      }
LAB_001534b2:
      Stream::WriteU8(this->stream_,uVar5,"alignment",No);
      pSVar10 = this->stream_;
      uVar5 = *(uint32_t *)((long)&pEVar1[1]._vptr_Expr + 4);
      pcVar8 = "memory offset";
      break;
    case Binary:
    case Compare:
    case Convert:
    case Ternary:
    case Unary:
      pSVar10 = this->stream_;
      OVar9.enum_ = *(Enum *)&pEVar1->field_0x3c;
      goto LAB_00153731;
    case Block:
      WriteOpcode(this->stream_,(Opcode)0x2);
      if ((pEVar1->type_ != Block) ||
         (WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_),
         pEVar1->type_ != Block)) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
        ;
LAB_00153ad5:
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                      ,0x48,pcVar8);
      }
      goto LAB_00153054;
    case Br:
      WriteOpcode(this->stream_,(Opcode)0xc);
      if (pEVar1->type_ != Br) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Br>, Base = wabt::Expr]"
        ;
        goto LAB_00153ad5;
      }
      goto LAB_00153414;
    case BrIf:
      WriteOpcode(this->stream_,(Opcode)0xd);
      if (pEVar1->type_ != BrIf) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::BrIf>, Base = wabt::Expr]"
        ;
        goto LAB_00153ad5;
      }
LAB_00153414:
      if ((int)pEVar1[1].loc.filename.size_ != 0) {
LAB_001539c6:
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h"
                      ,0x38,"Index wabt::Var::index() const");
      }
      pSVar10 = this->stream_;
      uVar5 = pEVar1[1].loc.field_1.field_0.line;
      pcVar8 = "break depth";
      break;
    case BrOnExn:
      WriteOpcode(this->stream_,(Opcode)0xa);
      if ((int)pEVar1[1].loc.filename.size_ != 0) goto LAB_001539c6;
      WriteU32Leb128(this->stream_,pEVar1[1].loc.field_1.field_0.line,"break depth");
      pSVar10 = this->stream_;
      uVar5 = Module::GetEventIndex
                        (this->module_,(Var *)&pEVar1[2].super_intrusive_list_base<wabt::Expr>);
      pcVar8 = "event index";
      break;
    case BrTable:
      WriteOpcode(this->stream_,(Opcode)0xe);
      WriteU32Leb128(this->stream_,
                     (int)((ulong)((long)pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_ -
                                  (long)pEVar1[1]._vptr_Expr) >> 3) * 0x38e38e39,"num targets");
      pEVar2 = pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      for (pEVar11 = (Expr *)pEVar1[1]._vptr_Expr; pEVar11 != pEVar2;
          pEVar11 = (Expr *)&pEVar11[1].super_intrusive_list_base<wabt::Expr>) {
        if ((int)(pEVar11->loc).filename.size_ != 0) goto LAB_001539c6;
        WriteU32Leb128(this->stream_,(pEVar11->loc).field_1.field_0.line,"break depth");
      }
      if (pEVar1[1].type_ != AtomicLoad) goto LAB_001539c6;
      uVar5 = *(uint32_t *)&pEVar1[2]._vptr_Expr;
      pSVar10 = this->stream_;
      pcVar8 = "break depth for default";
      break;
    case Call:
      IVar4 = Module::GetFuncIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar10 = this->stream_;
      OVar9.enum_ = Call;
      goto LAB_001530de;
    case CallIndirect:
      IVar4 = Module::GetFuncTypeIndex(this->module_,(FuncDeclaration *)(pEVar1 + 1));
      if (pEVar1->type_ != CallIndirect) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::CallIndirectExpr, Base = wabt::Expr]"
        ;
        goto LAB_00153ad5;
      }
      uVar5 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 3));
      pSVar10 = this->stream_;
      OVar9.enum_ = CallIndirect;
      goto LAB_0015337c;
    case Const:
      switch((int)pEVar1[1].loc.filename.size_) {
      case -5:
        WriteOpcode(this->stream_,(Opcode)0xd7);
        pSVar10 = this->stream_;
        local_48 = (_func_int **)pEVar1[1].loc.field_1.field_1.offset;
        pEStack_40 = *(Expr **)((long)&pEVar1[1].loc.field_1 + 8);
        pcVar8 = "v128 literal";
        goto LAB_00152f76;
      case -4:
        WriteOpcode(this->stream_,(Opcode)0x38);
        pSVar10 = this->stream_;
        local_48 = (_func_int **)pEVar1[1].loc.field_1.field_1.offset;
        pcVar8 = "f64 literal";
        size = 8;
        goto LAB_00152f7b;
      case -3:
        WriteOpcode(this->stream_,(Opcode)0x37);
        pSVar10 = this->stream_;
        local_48 = (_func_int **)CONCAT44(local_48._4_4_,pEVar1[1].loc.field_1.field_0.line);
        pcVar8 = "f32 literal";
        size = 4;
LAB_00152f7b:
        Stream::WriteData(pSVar10,&local_48,size,pcVar8,No);
        break;
      case -2:
        WriteOpcode(this->stream_,(Opcode)0x36);
        WriteS64Leb128(this->stream_,pEVar1[1].loc.field_1.field_1.offset,"i64 literal");
        break;
      case -1:
        WriteOpcode(this->stream_,(Opcode)0x35);
        WriteS32Leb128(this->stream_,pEVar1[1].loc.field_1.field_0.line,"i32 literal");
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer.cc"
                      ,0x201,
                      "void wabt::(anonymous namespace)::BinaryWriter::WriteExpr(const Func *, const Expr *)"
                     );
      }
      goto switchD_00152d60_default;
    case Drop:
      pSVar10 = this->stream_;
      OVar9.enum_ = Drop;
      goto LAB_00153731;
    case GlobalGet:
      IVar4 = Module::GetGlobalIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar10 = this->stream_;
      OVar9.enum_ = GlobalGet;
      goto LAB_001533db;
    case GlobalSet:
      IVar4 = Module::GetGlobalIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar10 = this->stream_;
      OVar9.enum_ = GlobalSet;
LAB_001533db:
      WriteOpcode(pSVar10,OVar9);
      pcVar8 = "global.get global index";
      reloc_type = GlobalIndexLEB;
      goto LAB_001533f1;
    case If:
      WriteOpcode(this->stream_,(Opcode)0x4);
      WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_);
      WriteExprList(this,func,(ExprList *)&pEVar1[3].loc.filename.size_);
      if (pEVar1[4].loc.field_1.field_1.offset != 0) {
        exprs_00 = (ExprList *)&pEVar1[4].loc;
        WriteOpcode(this->stream_,(Opcode)0x5);
        goto LAB_00153062;
      }
      goto LAB_00153067;
    case Load:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar6 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < AVar6) {
        uVar5 = 0;
        uVar7 = (ulong)AVar6;
        do {
          uVar7 = uVar7 >> 1;
          uVar5 = uVar5 + 1;
          bVar3 = 3 < AVar6;
          AVar6 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_0015369b;
    case LocalGet:
      if (func == (Func *)0x0) {
        uVar5 = 0xffffffff;
        if ((int)pEVar1[1].loc.filename.size_ == 0) {
          uVar5 = pEVar1[1].loc.field_1.field_0.line;
        }
      }
      else {
        uVar5 = Func::GetLocalIndex(func,(Var *)(pEVar1 + 1));
      }
      pSVar10 = this->stream_;
      OVar9.enum_ = LocalGet;
      goto LAB_001538e1;
    case LocalSet:
      if (func == (Func *)0x0) {
        uVar5 = 0xffffffff;
        if ((int)pEVar1[1].loc.filename.size_ == 0) {
          uVar5 = pEVar1[1].loc.field_1.field_0.line;
        }
      }
      else {
        uVar5 = Func::GetLocalIndex(func,(Var *)(pEVar1 + 1));
      }
      pSVar10 = this->stream_;
      OVar9.enum_ = LocalSet;
      goto LAB_001538e1;
    case LocalTee:
      if (func == (Func *)0x0) {
        uVar5 = 0xffffffff;
        if ((int)pEVar1[1].loc.filename.size_ == 0) {
          uVar5 = pEVar1[1].loc.field_1.field_0.line;
        }
      }
      else {
        uVar5 = Func::GetLocalIndex(func,(Var *)(pEVar1 + 1));
      }
      pSVar10 = this->stream_;
      OVar9.enum_ = LocalTee;
LAB_001538e1:
      WriteOpcode(pSVar10,OVar9);
      pSVar10 = this->stream_;
      pcVar8 = "local index";
      break;
    case Loop:
      WriteOpcode(this->stream_,(Opcode)0x3);
      if ((pEVar1->type_ != Loop) ||
         (WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_),
         pEVar1->type_ != Loop)) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
        ;
        goto LAB_00153ad5;
      }
LAB_00153054:
      exprs_00 = (ExprList *)&pEVar1[3].loc.filename.size_;
LAB_00153062:
      WriteExprList(this,func,exprs_00);
LAB_00153067:
      pSVar10 = this->stream_;
      OVar9.enum_ = End;
      goto LAB_00153731;
    case MemoryCopy:
      WriteOpcode(this->stream_,(Opcode)0xc8);
      WriteU32Leb128(this->stream_,0,"memory.copy reserved");
      pSVar10 = this->stream_;
      uVar5 = 0;
      pcVar8 = "memory.copy reserved";
      break;
    case DataDrop:
      IVar4 = Module::GetDataSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xc7);
      pSVar10 = this->stream_;
      pcVar8 = "data.drop segment";
      goto LAB_00153717;
    case MemoryFill:
      WriteOpcode(this->stream_,(Opcode)0xc9);
      pSVar10 = this->stream_;
      pcVar8 = "memory.fill reserved";
      goto LAB_001534ee;
    case MemoryGrow:
      WriteOpcode(this->stream_,(Opcode)0x34);
      pSVar10 = this->stream_;
      pcVar8 = "memory.grow reserved";
      goto LAB_001534ee;
    case MemoryInit:
      IVar4 = Module::GetDataSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xc6);
      WriteU32Leb128(this->stream_,IVar4,"memory.init segment");
      pSVar10 = this->stream_;
      pcVar8 = "memory.init reserved";
      IVar4 = 0;
LAB_00153717:
      WriteU32Leb128(pSVar10,IVar4,pcVar8);
      this->has_data_segment_instruction_ = true;
      goto switchD_00152d60_default;
    case MemorySize:
      WriteOpcode(this->stream_,(Opcode)0x33);
      pSVar10 = this->stream_;
      pcVar8 = "memory.size reserved";
LAB_001534ee:
      uVar5 = 0;
      break;
    case Nop:
      pSVar10 = this->stream_;
      OVar9.enum_ = Nop;
      goto LAB_00153731;
    case RefIsNull:
      pSVar10 = this->stream_;
      OVar9.enum_ = RefIsNull;
      goto LAB_00153731;
    case RefFunc:
      WriteOpcode(this->stream_,(Opcode)0xd4);
      if (pEVar1->type_ != RefFunc) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::RefFunc>, Base = wabt::Expr]"
        ;
        goto LAB_00153ad5;
      }
      IVar4 = Module::GetFuncIndex(this->module_,(Var *)(pEVar1 + 1));
      goto LAB_001530ef;
    case RefNull:
      pSVar10 = this->stream_;
      OVar9.enum_ = RefNull;
      goto LAB_00153731;
    case Rethrow:
      pSVar10 = this->stream_;
      OVar9.enum_ = Rethrow;
      goto LAB_00153731;
    case Return:
      pSVar10 = this->stream_;
      OVar9.enum_ = Return;
      goto LAB_00153731;
    case ReturnCall:
      IVar4 = Module::GetFuncIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar10 = this->stream_;
      OVar9.enum_ = ReturnCall;
LAB_001530de:
      WriteOpcode(pSVar10,OVar9);
LAB_001530ef:
      pcVar8 = "block type function index";
      reloc_type = First;
LAB_001533f1:
      WriteU32Leb128WithReloc(this,IVar4,pcVar8 + 0xb,reloc_type);
      goto switchD_00152d60_default;
    case ReturnCallIndirect:
      IVar4 = Module::GetFuncTypeIndex(this->module_,(FuncDeclaration *)(pEVar1 + 1));
      if (pEVar1->type_ != ReturnCallIndirect) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::ReturnCallIndirectExpr, Base = wabt::Expr]"
        ;
        goto LAB_00153ad5;
      }
      uVar5 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 3));
      pSVar10 = this->stream_;
      OVar9.enum_ = ReturnCallIndirect;
LAB_0015337c:
      WriteOpcode(pSVar10,OVar9);
      WriteU32Leb128WithReloc(this,IVar4,"signature index",TypeIndexLEB);
      pSVar10 = this->stream_;
      pcVar8 = "table index";
      break;
    case Select:
      if (((long)pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_ - (long)pEVar1[1]._vptr_Expr
           == 4) && (*(int *)pEVar1[1]._vptr_Expr == 0)) {
        pSVar10 = this->stream_;
        OVar9.enum_ = Select;
        goto LAB_00153731;
      }
      WriteOpcode(this->stream_,(Opcode)0x16);
      WriteU32Leb128(this->stream_,
                     (uint32_t)
                     ((ulong)((long)pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_ -
                             (long)pEVar1[1]._vptr_Expr) >> 2),"num result types");
      pEVar2 = pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      for (pEVar11 = (Expr *)pEVar1[1]._vptr_Expr; pEVar11 != pEVar2;
          pEVar11 = (Expr *)((long)&pEVar11->_vptr_Expr + 4)) {
        WriteS32Leb128(this->stream_,*(uint32_t *)&pEVar11->_vptr_Expr,"result type");
      }
      goto switchD_00152d60_default;
    case SimdLaneOp:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      if (pEVar1->type_ != SimdLaneOp) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::SimdLaneOpExpr, Base = wabt::Expr]"
        ;
        goto LAB_00153ad5;
      }
      Stream::WriteU8(this->stream_,(uint)*(byte *)&pEVar1[1]._vptr_Expr,"Simd Lane literal",No);
      goto switchD_00152d60_default;
    case SimdShuffleOp:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      if (pEVar1->type_ != SimdShuffleOp) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::SimdShuffleOpExpr, Base = wabt::Expr]"
        ;
        goto LAB_00153ad5;
      }
      pSVar10 = this->stream_;
      local_48 = pEVar1[1]._vptr_Expr;
      pEStack_40 = pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      pcVar8 = "Simd Lane[16] literal";
LAB_00152f76:
      size = 0x10;
      goto LAB_00152f7b;
    case LoadSplat:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar6 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < AVar6) {
        uVar5 = 0;
        uVar7 = (ulong)AVar6;
        do {
          uVar7 = uVar7 >> 1;
          uVar5 = uVar5 + 1;
          bVar3 = 3 < AVar6;
          AVar6 = (uint)uVar7;
        } while (bVar3);
      }
LAB_0015369b:
      Stream::WriteU8(this->stream_,uVar5,"alignment",No);
      pSVar10 = this->stream_;
      uVar5 = *(uint32_t *)((long)&pEVar1[1]._vptr_Expr + 4);
      pcVar8 = "load offset";
      break;
    case Store:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar6 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar5 = 0;
      if (1 < AVar6) {
        uVar5 = 0;
        uVar7 = (ulong)AVar6;
        do {
          uVar7 = uVar7 >> 1;
          uVar5 = uVar5 + 1;
          bVar3 = 3 < AVar6;
          AVar6 = (uint)uVar7;
        } while (bVar3);
      }
      Stream::WriteU8(this->stream_,uVar5,"alignment",No);
      pSVar10 = this->stream_;
      uVar5 = *(uint32_t *)((long)&pEVar1[1]._vptr_Expr + 4);
      pcVar8 = "store offset";
      break;
    case TableCopy:
      IVar4 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      uVar5 = Module::GetTableIndex
                        (this->module_,(Var *)&pEVar1[2].super_intrusive_list_base<wabt::Expr>);
      WriteOpcode(this->stream_,(Opcode)0xcc);
      WriteU32Leb128(this->stream_,IVar4,"table.copy dst_table");
      pSVar10 = this->stream_;
      pcVar8 = "table.copy src_table";
      break;
    case ElemDrop:
      uVar5 = Module::GetElemSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xcb);
      pSVar10 = this->stream_;
      pcVar8 = "elem.drop segment";
      break;
    case TableInit:
      uVar5 = Module::GetTableIndex
                        (this->module_,(Var *)&pEVar1[2].super_intrusive_list_base<wabt::Expr>);
      IVar4 = Module::GetElemSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xca);
      WriteU32Leb128(this->stream_,IVar4,"table.init segment");
      pSVar10 = this->stream_;
      pcVar8 = "table.init table";
      break;
    case TableGet:
      uVar5 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xcd);
      pSVar10 = this->stream_;
      pcVar8 = "table.get table index";
      break;
    case TableGrow:
      uVar5 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xcf);
      pSVar10 = this->stream_;
      pcVar8 = "table.grow table index";
      break;
    case TableSize:
      uVar5 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xd0);
      pSVar10 = this->stream_;
      pcVar8 = "table.size table index";
      break;
    case TableSet:
      uVar5 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xce);
      pSVar10 = this->stream_;
      pcVar8 = "table.set table index";
      break;
    case TableFill:
      uVar5 = Module::GetTableIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xd1);
      pSVar10 = this->stream_;
      pcVar8 = "table.fill table index";
      break;
    case Throw:
      WriteOpcode(this->stream_,(Opcode)0x8);
      if (pEVar1->type_ != Throw) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Throw>, Base = wabt::Expr]"
        ;
        goto LAB_00153ad5;
      }
      if ((int)pEVar1[1].loc.filename.size_ != 0) goto LAB_001539c6;
      pSVar10 = this->stream_;
      uVar5 = pEVar1[1].loc.field_1.field_0.line;
      pcVar8 = "throw event";
      break;
    case Try:
      WriteOpcode(this->stream_,(Opcode)0x6);
      WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_);
      WriteExprList(this,func,(ExprList *)&pEVar1[3].loc.filename.size_);
      WriteOpcode(this->stream_,(Opcode)0x7);
      exprs_00 = (ExprList *)&pEVar1[4].loc;
      goto LAB_00153062;
    case Last:
      pSVar10 = this->stream_;
      OVar9.enum_ = Unreachable;
LAB_00153731:
      WriteOpcode(pSVar10,OVar9);
    default:
      goto switchD_00152d60_default;
    }
    WriteU32Leb128(pSVar10,uVar5,pcVar8);
switchD_00152d60_default:
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
  } while( true );
}

Assistant:

void BinaryWriter::WriteExprList(const Func* func, const ExprList& exprs) {
  for (const Expr& expr : exprs) {
    WriteExpr(func, &expr);
  }
}